

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_a27195::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *filename;
  string *path;
  pointer pbVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Status SVar5;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_RCX;
  ActionMap *pAVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  CopyStatus CVar7;
  string result;
  Arguments arguments;
  string err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  char *local_188;
  char *local_180;
  char local_178;
  undefined7 uStack_177;
  undefined1 local_168 [24];
  undefined1 local_150 [32];
  undefined1 local_130 [17];
  undefined7 uStack_11f;
  undefined2 local_110;
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  _Any_data _Stack_c0;
  char *pcStack_b0;
  undefined1 local_a8 [24];
  pointer ppStack_90;
  pointer local_88;
  pointer ppStack_80;
  pointer local_78;
  undefined1 local_68 [16];
  long local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_e8._0_8_ = (ActionMap *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "CREATE_LINK must be called with at least two additional arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_e8._0_8_ != (ActionMap *)local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
    }
    return false;
  }
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    local_88 = (pointer)0x0;
    ppStack_80 = (pointer)0x0;
    local_a8._16_8_ = (_Manager_type)0x0;
    ppStack_90 = (pointer)0x0;
    local_a8._0_8_ = 0;
    local_a8._8_8_ = 0;
    _Stack_c0._8_8_ = 0;
    pcStack_b0 = (char *)0x0;
    local_d8._16_8_ = (pointer)0x0;
    _Stack_c0._M_unused._M_object = (char *)0x0;
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_e8._0_8_ = (ActionMap *)0x0;
    local_e8._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "RESULT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_e8,name,in_RCX);
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_e8,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_e8,name_01,0x21);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleCreateLinkCommand::parser,(ActionMap *)local_e8);
    ArgumentParser::Base::~Base((Base *)local_e8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCreateLinkCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_d8._0_8_ = &local_48;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_168._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  local_130._8_8_ = 0;
  local_130[0x10] = 0;
  local_110 = 0;
  local_e8._0_8_ = &HandleCreateLinkCommand::parser;
  local_e8._8_8_ = (pointer)0x0;
  local_d8._8_8_ = local_150 + 0x20;
  local_d8._16_8_ = (pointer)0x0;
  _Stack_c0._M_unused._M_object = (char *)0x0;
  _Stack_c0._8_8_ = 0;
  pcStack_b0 = (char *)0x0;
  local_a8._0_8_ = 0;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = (_Manager_type)0x0;
  ppStack_90 = (pointer)0x0;
  local_88 = (pointer)((ulong)local_88 & 0xffffffffffffff00);
  local_130._0_8_ = local_130 + 0x10;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_e8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_168,0);
  if ((_Manager_type)local_a8._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   "unknown argument: \"",
                   local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_168,local_168._8_8_,0,'\x01')
    ;
    pAVar6 = (ActionMap *)(plVar4 + 2);
    if ((ActionMap *)*plVar4 == pAVar6) {
      local_d8._0_8_ =
           (((Base *)&pAVar6->Keywords)->Bindings).Keywords.
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           .
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8._8_8_ = plVar4[3];
      local_e8._0_8_ = (ActionMap *)local_d8;
    }
    else {
      local_d8._0_8_ =
           (((Base *)&pAVar6->Keywords)->Bindings).Keywords.
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           .
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_e8._0_8_ = (ActionMap *)*plVar4;
    }
    local_e8._8_8_ = plVar4[1];
    *plVar4 = (long)pAVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_e8._0_8_ != (ActionMap *)local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
    }
    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    bVar2 = false;
    goto LAB_002c08a7;
  }
  filename = pbVar1 + 1;
  path = pbVar1 + 2;
  local_188 = &local_178;
  local_180 = (char *)0x0;
  local_178 = '\0';
  __n = pbVar1[1]._M_string_length;
  if ((__n == pbVar1[2]._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((filename->_M_dataplus)._M_p,(path->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
    std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,0x803861);
LAB_002c07ba:
    if (local_130._8_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002c088a:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      value_00._M_str = local_188;
      value_00._M_len = (size_t)local_180;
      cmMakefile::AddDefinition(status->Makefile,(string *)(local_150 + 0x20),value_00);
    }
  }
  else {
    if ((local_110._1_1_ == '\0') && (bVar2 = cmsys::SystemTools::FileExists(filename), !bVar2)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     "Cannot hard link \'",filename);
      plVar4 = (long *)std::__cxx11::string::append(local_168);
      pAVar6 = (ActionMap *)(plVar4 + 2);
      if ((ActionMap *)*plVar4 == pAVar6) {
        local_d8._0_8_ =
             (((Base *)&pAVar6->Keywords)->Bindings).Keywords.
             super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             .
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_d8._8_8_ = plVar4[3];
        local_e8._0_8_ = (ActionMap *)local_d8;
      }
      else {
        local_d8._0_8_ =
             (((Base *)&pAVar6->Keywords)->Bindings).Keywords.
             super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             .
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8._0_8_ = (ActionMap *)*plVar4;
      }
      local_e8._8_8_ = plVar4[1];
      *plVar4 = (long)pAVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_188,(string *)local_e8);
      if ((ActionMap *)local_e8._0_8_ != (ActionMap *)local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
      }
      if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      goto LAB_002c07ba;
    }
    bVar2 = cmsys::SystemTools::PathExists(path);
    if ((!bVar2) || (SVar5 = cmsys::SystemTools::RemoveFile(path), SVar5.Kind_ == Success)) {
      if (local_110._1_1_ == '\x01') {
        local_108._M_dataplus._M_p = (pointer)cmSystemTools::CreateSymlinkQuietly(filename,path);
        if ((Kind)local_108._M_dataplus._M_p == Success) goto LAB_002c06a2;
        cmsys::Status::GetString_abi_cxx11_((string *)local_168,(Status *)(local_130 + 0x28));
        cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                  ((string *)local_e8,(char (*) [33])"failed to create symbolic link \'",path,
                   (char (*) [4])0x810fbe,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
LAB_002c05f3:
        std::__cxx11::string::operator=((string *)&local_188,(string *)local_e8);
        if ((ActionMap *)local_e8._0_8_ != (ActionMap *)local_d8) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
        }
        if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        bVar2 = false;
      }
      else {
        local_108._M_dataplus._M_p = (pointer)cmSystemTools::CreateLinkQuietly(filename,path);
        if ((Kind)local_108._M_dataplus._M_p != Success) {
          cmsys::Status::GetString_abi_cxx11_((string *)local_168,(Status *)(local_130 + 0x28));
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                    ((string *)local_e8,(char (*) [24])"failed to create link \'",path,
                     (char (*) [4])0x810fbe,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
          ;
          goto LAB_002c05f3;
        }
LAB_002c06a2:
        bVar2 = true;
      }
      if ((!bVar2) && ((char)local_110 == '\x01')) {
        CVar7 = cmsys::SystemTools::CopyFileAlways(filename,path);
        local_108._M_dataplus._M_p = (pointer)CVar7.super_Status;
        if (CVar7.super_Status.Kind_ == Success) {
          bVar2 = true;
        }
        else {
          cmsys::Status::GetString_abi_cxx11_((string *)local_168,(Status *)(local_130 + 0x28));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"Copy failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          std::__cxx11::string::operator=((string *)&local_188,(string *)local_e8);
          if ((ActionMap *)local_e8._0_8_ != (ActionMap *)local_d8) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
          }
          if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
        }
      }
      if (bVar2) {
        std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x805dcc);
LAB_002c0858:
        bVar2 = true;
        if (local_130._8_8_ != 0) {
          value_01._M_str = local_188;
          value_01._M_len = (size_t)local_180;
          cmMakefile::AddDefinition(status->Makefile,(string *)(local_150 + 0x20),value_01);
        }
        goto LAB_002c088c;
      }
      if (local_130._8_8_ != 0) goto LAB_002c0858;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_002c088a;
    }
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_e8._0_8_ = (ActionMap *)0x17;
    local_e8._8_8_ = "Failed to create link \'";
    local_d8._0_8_ = (pointer)0x0;
    local_d8._16_8_ = pbVar1[2]._M_dataplus._M_p;
    local_d8._8_8_ = pbVar1[2]._M_string_length;
    _Stack_c0._M_unused._M_object = (char *)0x0;
    _Stack_c0._8_8_ = 0x2b;
    pcStack_b0 = "\' because existing path cannot be removed: ";
    local_a8._0_8_ = 0;
    local_a8._8_8_ = local_68._8_8_;
    local_a8._16_8_ = local_68._0_8_;
    local_168._16_8_ = local_150;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = &DAT_00000001;
    local_150[0] = '\n';
    local_88 = (pointer)&DAT_00000001;
    local_78 = (pointer)0x0;
    views._M_len = 5;
    views._M_array = (iterator)local_e8;
    ppStack_90 = (pointer)local_68;
    ppStack_80 = (pointer)local_168._16_8_;
    cmCatViews((string *)(local_130 + 0x28),views);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_58 + 1);
    }
    bVar2 = local_130._8_8_ != 0;
    if (local_130._8_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      value._M_str = local_108._M_dataplus._M_p;
      value._M_len = local_108._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,(string *)(local_150 + 0x20),value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002c088c:
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
LAB_002c08a7:
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,CONCAT71(uStack_11f,local_130[0x10]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar2;
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if (cmSystemTools::PathExists(newFileName) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    auto err = cmStrCat("Failed to create link '", newFileName,
                        "' because existing path cannot be removed: ",
                        cmSystemTools::GetLastSystemError(), '\n');

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
      return true;
    }
    status.SetError(err);
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}